

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall AggressiveBotStrategy::intInput(AggressiveBotStrategy *this,StrategyContext context)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  
  switch(context) {
  case ATTACK_FROM_COUNTRY:
    iVar2 = attackFromCountryIndex(this);
    break;
  case ATTACK_TO_COUNTRY:
    iVar2 = attackToCountryIndex(this);
    break;
  case ATTACK_DICE_COUNT:
    iVar1 = *((this->super_PlayerStrategy).from)->pNumberOfTroops;
    iVar2 = 3;
    if (iVar1 < 4) {
      iVar2 = iVar1 + -1;
    }
    break;
  case ATTACK_NEW_ARMY_COUNT:
    iVar2 = 1;
    break;
  case DEFEND_DICE_COUNT:
    iVar2 = (1 < *((this->super_PlayerStrategy).to)->pNumberOfTroops) + 1;
    break;
  default:
    iVar2 = -1;
    break;
  case FORTIFY_FROM_COUNTRY:
    iVar2 = fortifyFromCountryIndex(this);
    break;
  case FORTIFY_TO_COUNTRY:
    iVar2 = fortifyToCountryIndex(this);
    break;
  case FORTIFY_ARMY_COUNT:
    iVar2 = *((this->super_PlayerStrategy).from)->pNumberOfTroops + -1;
    break;
  case REINFORCE_CARD_COUNT:
    iVar2 = numCards(this);
    break;
  case REINFORCE_ARMY_COUNT:
    iVar2 = reinforceArmyCount(this);
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  return iVar2;
}

Assistant:

int AggressiveBotStrategy::intInput(StrategyContext context) {
    int count = 0;

    switch ((int) context) {
        case StrategyContext::ATTACK_FROM_COUNTRY:
            count = attackFromCountryIndex();
            break;
        case StrategyContext::ATTACK_TO_COUNTRY:
            count = attackToCountryIndex();
            break;
        case StrategyContext::ATTACK_DICE_COUNT:
            count = attackNumDice();
            break;
        case StrategyContext::ATTACK_NEW_ARMY_COUNT:
            count = 1;
            break;
        case StrategyContext::DEFEND_DICE_COUNT:
            count = defendNumDice();
            break;
        case StrategyContext::FORTIFY_FROM_COUNTRY:
            count = fortifyFromCountryIndex();
            break;
        case StrategyContext::FORTIFY_TO_COUNTRY:
            count = fortifyToCountryIndex();
            break;
        case StrategyContext::FORTIFY_ARMY_COUNT:
            count = fortifyArmyCount();
            break;
        case StrategyContext::REINFORCE_ARMY_COUNT:
            count = reinforceArmyCount();
            break;
        case StrategyContext::REINFORCE_CARD_COUNT:
            count = numCards();
            break;
        default: {
            count = -1;
        }
    }
    std::cout << count << std::endl;
    return count;
}